

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O1

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationMatrix<-1,_-1,_int>::operator=
          (PermutationMatrix<_1,__1,_int> *this,PermutationMatrix<_1,__1,_int> *other)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  undefined8 uVar6;
  Index index;
  ulong uVar7;
  ActualDstType actualDst;
  long lVar8;
  
  piVar3 = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  lVar8 = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if ((this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != lVar8) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,lVar8,1);
  }
  piVar4 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar5 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar7 = uVar5 + 3;
  if (-1 < (long)uVar5) {
    uVar7 = uVar5;
  }
  uVar7 = uVar7 & 0xfffffffffffffffc;
  if (3 < (long)uVar5) {
    lVar8 = 0;
    do {
      piVar1 = piVar3 + lVar8;
      uVar6 = *(undefined8 *)(piVar1 + 2);
      piVar2 = piVar4 + lVar8;
      *(undefined8 *)piVar2 = *(undefined8 *)piVar1;
      *(undefined8 *)(piVar2 + 2) = uVar6;
      lVar8 = lVar8 + 4;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < (long)uVar5) {
    do {
      piVar4[uVar7] = piVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  return this;
}

Assistant:

PermutationMatrix& operator=(const PermutationMatrix& other)
    {
      m_indices = other.m_indices;
      return *this;
    }